

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfont.cpp
# Opt level: O1

void __thiscall QFont::QFont(QFont *this,QStringList *families,int pointSize,int weight,bool italic)

{
  QFontPrivate *pQVar1;
  ulong uVar2;
  ulong uVar3;
  qreal qVar4;
  
  pQVar1 = (QFontPrivate *)operator_new(0x98);
  QFontPrivate::QFontPrivate(pQVar1);
  (this->d).d.ptr = pQVar1;
  LOCK();
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type)
        (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int> + 1);
  UNLOCK();
  this->resolve_mask = 0x20000;
  if (pointSize < 1) {
    qVar4 = 12.0;
  }
  else {
    this->resolve_mask = 0x20002;
    qVar4 = (qreal)pointSize;
  }
  if (weight < 0) {
    uVar3 = 0x1900000000000;
  }
  else {
    *(byte *)&this->resolve_mask = (byte)this->resolve_mask | 0x30;
    uVar3 = (ulong)(weight & 0x3ff) << 0x28;
  }
  if (italic) {
    *(byte *)&this->resolve_mask = (byte)this->resolve_mask | 0x20;
    uVar2 = 0x10000000;
  }
  else {
    uVar2 = 0;
  }
  QArrayDataPointer<QString>::operator=
            ((QArrayDataPointer<QString> *)&((this->d).d.ptr)->request,&families->d);
  pQVar1 = (this->d).d.ptr;
  (pQVar1->request).pointSize = qVar4;
  (pQVar1->request).pixelSize = -1.0;
  *(ulong *)&(pQVar1->request).field_0x60 =
       *(ulong *)&(pQVar1->request).field_0x60 & 0xfffc00ffffffffff | uVar3;
  pQVar1 = (this->d).d.ptr;
  *(ulong *)&(pQVar1->request).field_0x60 =
       *(ulong *)&(pQVar1->request).field_0x60 & 0xffffffffcfffffff | uVar2;
  return;
}

Assistant:

QFont::QFont(const QStringList &families, int pointSize, int weight, bool italic)
    : d(new QFontPrivate()), resolve_mask(QFont::FamiliesResolved)
{
    if (pointSize <= 0)
        pointSize = 12;
    else
        resolve_mask |= QFont::SizeResolved;

    if (weight < 0)
        weight = Normal;
    else
        resolve_mask |= QFont::WeightResolved | QFont::StyleResolved;

    if (italic)
        resolve_mask |= QFont::StyleResolved;

    d->request.families = families;
    d->request.pointSize = qreal(pointSize);
    d->request.pixelSize = -1;
    d->request.weight = weight;
    d->request.style = italic ? QFont::StyleItalic : QFont::StyleNormal;
}